

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O0

void __thiscall pstore::database::sync(database *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  element_type *peVar4;
  file_base *pfVar5;
  undefined4 extraout_var;
  value_type vVar6;
  uint64_t old_logical_size;
  uint in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [32];
  ulong local_58;
  uint64_t file_size;
  undefined1 local_48 [24];
  typed_address<pstore::trailer> new_footer_pos;
  unique_ptr<pstore::region::factory,_std::default_delete<pstore::region::factory>_> uStack_20;
  uint current_revision;
  typed_address<pstore::trailer> footer_pos;
  bool is_newer;
  uint revision_local;
  database *this_local;
  
  footer_pos.a_.a_._3_1_ = 0;
  footer_pos.a_.a_._4_4_ = in_ESI;
  uStack_20._M_t.
  super___uniq_ptr_impl<pstore::region::factory,_std::default_delete<pstore::region::factory>_>._M_t
  .super__Tuple_impl<0UL,_pstore::region::factory_*,_std::default_delete<pstore::region::factory>_>.
  super__Head_base<0UL,_pstore::region::factory_*,_false>._M_head_impl =
       (__uniq_ptr_data<pstore::region::factory,_std::default_delete<pstore::region::factory>,_true,_true>
        )sizes::footer_pos(&this->size_);
  if (footer_pos.a_.a_._4_4_ == 0xffffffff) {
    footer_pos.a_.a_._3_1_ = 1;
  }
  else {
    uVar2 = get_current_revision(this);
    if (footer_pos.a_.a_._4_4_ == uVar2) {
      return;
    }
    if (uVar2 < footer_pos.a_.a_._4_4_) {
      footer_pos.a_.a_._3_1_ = 1;
    }
  }
  if ((footer_pos.a_.a_._3_1_ & 1) == 0) {
    new_footer_pos = typed_address<pstore::trailer>::null();
    bVar1 = typed_address<pstore::trailer>::operator!=
                      ((typed_address<pstore::trailer> *)&stack0xffffffffffffffe0,&new_footer_pos);
    if (!bVar1) {
      assert_failed("is_newer || footer_pos != typed_address<trailer>::null ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/database.cpp"
                    ,0xaf);
    }
  }
  if ((footer_pos.a_.a_._3_1_ & 1) != 0) {
    file_size = (uint64_t)typed_address<pstore::header>::null();
    getro<pstore::header,void>((database *)local_48,(typed_address<pstore::header>)this);
    peVar4 = std::
             __shared_ptr_access<const_pstore::header,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_pstore::header,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_48);
    local_48._16_8_ =
         std::atomic<pstore::typed_address<pstore::trailer>_>::load
                   (&peVar4->footer_pos,memory_order_seq_cst);
    std::shared_ptr<const_pstore::header>::~shared_ptr((shared_ptr<const_pstore::header> *)local_48)
    ;
    if ((footer_pos.a_.a_._4_4_ == 0xffffffff) &&
       (bVar1 = typed_address<pstore::trailer>::operator==
                          ((typed_address<pstore::trailer> *)(local_48 + 0x10),
                           (typed_address<pstore::trailer> *)&stack0xffffffffffffffe0), bVar1)) {
      return;
    }
    uStack_20._M_t.
    super___uniq_ptr_impl<pstore::region::factory,_std::default_delete<pstore::region::factory>_>.
    _M_t.
    super__Tuple_impl<0UL,_pstore::region::factory_*,_std::default_delete<pstore::region::factory>_>
    .super__Head_base<0UL,_pstore::region::factory_*,_false>._M_head_impl =
         (__uniq_ptr_data<pstore::region::factory,_std::default_delete<pstore::region::factory>,_true,_true>
          )(__uniq_ptr_data<pstore::region::factory,_std::default_delete<pstore::region::factory>,_true,_true>
            )local_48._16_8_;
    pfVar5 = storage::file(&this->storage_);
    iVar3 = (*pfVar5->_vptr_file_base[9])();
    local_58 = CONCAT44(extraout_var,iVar3);
    vVar6 = typed_address<pstore::trailer>::absolute
                      ((typed_address<pstore::trailer> *)&stack0xffffffffffffffe0);
    if (local_58 < vVar6 + 0x70) {
      pfVar5 = storage::file(&this->storage_);
      (*pfVar5->_vptr_file_base[5])();
      raise<pstore::error_code,std::__cxx11::string>(footer_corrupt,local_78);
    }
    old_logical_size = sizes::logical_size(&this->size_);
    vVar6 = typed_address<pstore::trailer>::absolute
                      ((typed_address<pstore::trailer> *)&stack0xffffffffffffffe0);
    storage::map_bytes(&this->storage_,old_logical_size,vVar6 + 0x70);
    sizes::update_footer_pos
              (&this->size_,
               (typed_address<pstore::trailer>)
               uStack_20._M_t.
               super___uniq_ptr_impl<pstore::region::factory,_std::default_delete<pstore::region::factory>_>
               ._M_t.
               super__Tuple_impl<0UL,_pstore::region::factory_*,_std::default_delete<pstore::region::factory>_>
               .super__Head_base<0UL,_pstore::region::factory_*,_false>._M_head_impl);
    trailer::validate(this,(typed_address<pstore::trailer>)
                           uStack_20._M_t.
                           super___uniq_ptr_impl<pstore::region::factory,_std::default_delete<pstore::region::factory>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_pstore::region::factory_*,_std::default_delete<pstore::region::factory>_>
                           .super__Head_base<0UL,_pstore::region::factory_*,_false>._M_head_impl);
  }
  if (footer_pos.a_.a_._4_4_ != 0xffffffff) {
    uStack_20._M_t.
    super___uniq_ptr_impl<pstore::region::factory,_std::default_delete<pstore::region::factory>_>.
    _M_t.
    super__Tuple_impl<0UL,_pstore::region::factory_*,_std::default_delete<pstore::region::factory>_>
    .super__Head_base<0UL,_pstore::region::factory_*,_false>._M_head_impl =
         (__uniq_ptr_data<pstore::region::factory,_std::default_delete<pstore::region::factory>,_true,_true>
          )older_revision_footer_pos(this,footer_pos.a_.a_._4_4_);
  }
  clear_index_cache(this);
  sizes::update_footer_pos
            (&this->size_,
             (typed_address<pstore::trailer>)
             uStack_20._M_t.
             super___uniq_ptr_impl<pstore::region::factory,_std::default_delete<pstore::region::factory>_>
             ._M_t.
             super__Tuple_impl<0UL,_pstore::region::factory_*,_std::default_delete<pstore::region::factory>_>
             .super__Head_base<0UL,_pstore::region::factory_*,_false>._M_head_impl);
  return;
}

Assistant:

void database::sync (unsigned const revision) {
        // If revision <= current revision then we don't need to start at head! We do so if the
        // revision is later than the current region (that's what is_newer is about with footer_pos
        // tracking the current footer as it moves backwards).
        bool is_newer = false;
        typed_address<trailer> footer_pos = size_.footer_pos ();

        if (revision == head_revision) {
            // If we're asked for the head, then we always need a full check to see if there's
            // a newer revision.
            is_newer = true;
        } else {
            unsigned const current_revision = this->get_current_revision ();
            // An early out if the user requests the same revision that we already have.
            if (revision == current_revision) {
                return;
            }
            if (revision > current_revision) {
                is_newer = true;
            }
        }

        // The transactions form a singly linked list with the newest revision at its head.
        // If we're asked for a revision _newer_ that the currently synced number then we need
        // to hunt backwards starting at the head. Syncing to an older revision is simpler because
        // we can work back from the current revision.
        PSTORE_ASSERT (is_newer || footer_pos != typed_address<trailer>::null ());
        if (is_newer) {
            // This atomic read of footer_pos fixes our view of the head-revision. Any transactions
            // after this point won't be seen by this process.
            auto const new_footer_pos =
                this->getro (typed_address<header>::null ())->footer_pos.load ();

            if (revision == head_revision && new_footer_pos == footer_pos) {
                // We were asked for the head revision but the head turns out to the same
                // as the one to which we're currently synced. The previous early out code didn't
                // have sufficient context to catch this case, but here we do. Nothing more to do.
                return;
            }

            footer_pos = new_footer_pos;

            // Always check file size after loading from the footer.
            auto const file_size = storage_.file ()->size ();

            // Perform a proper footer validity check.
            if (footer_pos.absolute () + sizeof (trailer) > file_size) {
                raise (error_code::footer_corrupt, storage_.file ()->path ());
            }

            // We may need to map additional data from the file. If another process has added
            // data to the store since we opened our connection, then a sync may want to access
            // that new data. Deal with that possibility here.
            storage_.map_bytes (size_.logical_size (), footer_pos.absolute () + sizeof (trailer));

            size_.update_footer_pos (footer_pos);
            trailer::validate (*this, footer_pos);
        }

        // The code above moves to the head revision. If that's what was requested, then we're done.
        // If a specific numbered revision is needed, then we need to search for it.
        if (revision != head_revision) {
            footer_pos = this->older_revision_footer_pos (revision);
        }

        // We must clear the index cache because the current revision has changed.
        this->clear_index_cache ();
        size_.update_footer_pos (footer_pos);
    }